

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

void __thiscall
QGraphicsAnchorLayoutPrivate::restoreSimplifiedConstraints
          (QGraphicsAnchorLayoutPrivate *this,ParallelAnchorData *parallel)

{
  QSimplexConstraint *this_00;
  bool bVar1;
  qsizetype qVar2;
  const_reference ppQVar3;
  double *pdVar4;
  ParallelAnchorData *in_RSI;
  long in_FS_OFFSET;
  QSimplexConstraint *c_1;
  int i_1;
  bool needsReverse;
  QSimplexConstraint *c;
  int i;
  qreal v_1;
  qreal v;
  QSimplexConstraint *in_stack_fffffffffffffec8;
  AnchorData *in_stack_fffffffffffffed0;
  QSimplexVariable *in_stack_fffffffffffffed8;
  QSimplexConstraint *in_stack_fffffffffffffee0;
  QSimplexVariable *local_110;
  QSimplexVariable *local_f8;
  QSimplexVariable *local_d8;
  QSimplexVariable *local_c0;
  QSimplexVariable *local_a8;
  int local_80;
  int local_5c;
  QSimplexVariable *local_40;
  QSimplexVariable *local_38;
  double local_30;
  QSimplexVariable *local_28;
  QSimplexVariable *local_20;
  QSimplexVariable *local_18;
  double local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((byte)(in_RSI->super_AnchorData).field_0x78 >> 3 & 1) != 0) {
    for (local_5c = 0; qVar2 = QList<QSimplexConstraint_*>::size(&in_RSI->m_firstConstraints),
        local_5c < qVar2; local_5c = local_5c + 1) {
      ppQVar3 = QList<QSimplexConstraint_*>::at
                          ((QList<QSimplexConstraint_*> *)in_stack_fffffffffffffed0,
                           (qsizetype)in_stack_fffffffffffffec8);
      this_00 = *ppQVar3;
      local_a8 = (QSimplexVariable *)0x0;
      if (in_RSI != (ParallelAnchorData *)0x0) {
        local_a8 = &(in_RSI->super_AnchorData).super_QSimplexVariable;
      }
      local_18 = local_a8;
      pdVar4 = QHash<QSimplexVariable_*,_double>::operator[]
                         (&in_stack_fffffffffffffee0->variables,
                          (QSimplexVariable **)in_stack_fffffffffffffed8);
      local_10 = *pdVar4;
      local_c0 = (QSimplexVariable *)0x0;
      if (in_RSI != (ParallelAnchorData *)0x0) {
        local_c0 = &(in_RSI->super_AnchorData).super_QSimplexVariable;
      }
      local_20 = local_c0;
      QHash<QSimplexVariable_*,_double>::remove(&this_00->variables,(char *)&local_20);
      local_d8 = (QSimplexVariable *)0x0;
      if (in_RSI->firstEdge != (AnchorData *)0x0) {
        local_d8 = &in_RSI->firstEdge->super_QSimplexVariable;
      }
      local_28 = local_d8;
      QHash<QSimplexVariable_*,_double>::insert
                ((QHash<QSimplexVariable_*,_double> *)in_stack_fffffffffffffed0,
                 (QSimplexVariable **)in_stack_fffffffffffffec8,(double *)0x93c640);
    }
    bVar1 = QtGraphicsAnchorLayout::ParallelAnchorData::secondForward(in_RSI);
    for (local_80 = 0; qVar2 = QList<QSimplexConstraint_*>::size(&in_RSI->m_secondConstraints),
        local_80 < qVar2; local_80 = local_80 + 1) {
      ppQVar3 = QList<QSimplexConstraint_*>::at
                          ((QList<QSimplexConstraint_*> *)in_stack_fffffffffffffed0,
                           (qsizetype)in_stack_fffffffffffffec8);
      in_stack_fffffffffffffec8 = *ppQVar3;
      local_f8 = (QSimplexVariable *)0x0;
      if (in_RSI != (ParallelAnchorData *)0x0) {
        local_f8 = &(in_RSI->super_AnchorData).super_QSimplexVariable;
      }
      local_38 = local_f8;
      pdVar4 = QHash<QSimplexVariable_*,_double>::operator[]
                         (&in_stack_fffffffffffffee0->variables,
                          (QSimplexVariable **)in_stack_fffffffffffffed8);
      local_30 = *pdVar4;
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        local_30 = local_30 * -1.0;
      }
      local_110 = (QSimplexVariable *)0x0;
      if (in_RSI != (ParallelAnchorData *)0x0) {
        local_110 = &(in_RSI->super_AnchorData).super_QSimplexVariable;
      }
      local_40 = local_110;
      in_stack_fffffffffffffee0 = in_stack_fffffffffffffec8;
      QHash<QSimplexVariable_*,_double>::remove
                (&in_stack_fffffffffffffec8->variables,(char *)&local_40);
      in_stack_fffffffffffffed0 = in_RSI->secondEdge;
      in_stack_fffffffffffffed8 = (QSimplexVariable *)0x0;
      if (in_stack_fffffffffffffed0 != (AnchorData *)0x0) {
        in_stack_fffffffffffffed8 = &in_stack_fffffffffffffed0->super_QSimplexVariable;
      }
      QHash<QSimplexVariable_*,_double>::insert
                ((QHash<QSimplexVariable_*,_double> *)in_stack_fffffffffffffed0,
                 (QSimplexVariable **)in_stack_fffffffffffffec8,(double *)0x93c81c);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsAnchorLayoutPrivate::restoreSimplifiedConstraints(ParallelAnchorData *parallel)
{
    if (!parallel->isCenterAnchor)
        return;

    for (int i = 0; i < parallel->m_firstConstraints.size(); ++i) {
        QSimplexConstraint *c = parallel->m_firstConstraints.at(i);
        qreal v = c->variables[parallel];
        c->variables.remove(parallel);
        c->variables.insert(parallel->firstEdge, v);
    }

    // When restoring, we might have to revert constraints back. See comments on
    // addAnchorMaybeParallel().
    const bool needsReverse = !parallel->secondForward();

    for (int i = 0; i < parallel->m_secondConstraints.size(); ++i) {
        QSimplexConstraint *c = parallel->m_secondConstraints.at(i);
        qreal v = c->variables[parallel];
        if (needsReverse)
            v *= -1;
        c->variables.remove(parallel);
        c->variables.insert(parallel->secondEdge, v);
    }
}